

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlReaderNewIO(xmlTextReaderPtr reader,xmlInputReadCallback ioread,xmlInputCloseCallback ioclose
                  ,void *ioctx,char *URL,char *encoding,int options)

{
  int iVar1;
  xmlParserInputBufferPtr input;
  
  if (reader != (xmlTextReaderPtr)0x0 && ioread != (xmlInputReadCallback)0x0) {
    input = xmlParserInputBufferCreateIO(ioread,ioclose,ioctx,XML_CHAR_ENCODING_NONE);
    if (input != (xmlParserInputBufferPtr)0x0) {
      iVar1 = xmlTextReaderSetup(reader,input,URL,encoding,options);
      return iVar1;
    }
    if (ioclose != (xmlInputCloseCallback)0x0) {
      (*ioclose)(ioctx);
    }
  }
  return -1;
}

Assistant:

int
xmlReaderNewIO(xmlTextReaderPtr reader, xmlInputReadCallback ioread,
               xmlInputCloseCallback ioclose, void *ioctx,
               const char *URL, const char *encoding, int options)
{
    xmlParserInputBufferPtr input;

    if (ioread == NULL)
        return (-1);
    if (reader == NULL)
        return (-1);

    input = xmlParserInputBufferCreateIO(ioread, ioclose, ioctx,
                                         XML_CHAR_ENCODING_NONE);
    if (input == NULL) {
        if (ioclose != NULL)
            ioclose(ioctx);
        return (-1);
    }
    return (xmlTextReaderSetup(reader, input, URL, encoding, options));
}